

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O3

void __thiscall Kss_Emu::set_bank(Kss_Emu *this,int logical,int physical)

{
  byte bVar1;
  uint size;
  uint offset;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint addr;
  
  bVar1 = (this->header_).super_header_t.bank_mode;
  size = 0x4000 >> (bVar1 >> 7);
  addr = 0x8000;
  if (logical != 0) {
    addr = (bVar1 >> 7 | 4) << 0xd;
  }
  uVar4 = physical - (uint)(this->header_).super_header_t.first_bank;
  if (uVar4 < (uint)this->bank_count) {
    uVar2 = 0;
    do {
      uVar3 = (uVar4 * size + uVar2 & (this->rom).super_Rom_Data_.mask) -
              (this->rom).super_Rom_Data_.rom_addr;
      if ((int)(this->rom).super_Rom_Data_.rom.size_ - 0x2008U < uVar3) {
        uVar3 = 0;
      }
      Kss_Cpu::map_mem(&this->super_Kss_Cpu,addr + uVar2,0x2000,this->unmapped_write,
                       (this->rom).super_Rom_Data_.rom.begin_ + uVar3);
      uVar2 = uVar2 + 0x2000;
    } while (uVar2 < size);
    return;
  }
  Kss_Cpu::map_mem(&this->super_Kss_Cpu,addr,size,this->ram + addr,this->ram + addr);
  return;
}

Assistant:

void Kss_Emu::set_bank( int logical, int physical )
{
	unsigned const bank_size = this->bank_size();
	
	unsigned addr = 0x8000;
	if ( logical && bank_size == 8 * 1024 )
		addr = 0xA000;
	
	physical -= header_.first_bank;
	if ( (unsigned) physical >= (unsigned) bank_count )
	{
		byte* data = ram + addr;
		cpu::map_mem( addr, bank_size, data, data );
	}
	else
	{
		long phys = physical * (blargg_long) bank_size;
		for ( unsigned offset = 0; offset < bank_size; offset += page_size )
			cpu::map_mem( addr + offset, page_size,
					unmapped_write, rom.at_addr( phys + offset ) );
	}
}